

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O2

void __thiscall
Atmosphere::print_tabular(Atmosphere *this,double h_start,double h_end,double h_step)

{
  double **table;
  uint size;
  ulong uVar1;
  ulong uVar2;
  
  table = tabulate(this,h_start,h_end,h_step);
  size = (uint)((h_end - h_start) / h_step + 1.0);
  print_tabular(table,size);
  uVar2 = 0;
  uVar1 = (ulong)size;
  if ((int)size < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (table[uVar2] != (double *)0x0) {
      operator_delete__(table[uVar2]);
    }
  }
  if (table != (double **)0x0) {
    operator_delete__(table);
    return;
  }
  return;
}

Assistant:

void print_tabular(double h_start, double h_end, double h_step) {
        double **result = this->tabulate(h_start, h_end, h_step);
        const int size = (const int) ((h_end - h_start) / h_step + 1);
        Atmosphere::print_tabular(result, size);

        //Free each sub-array
        for (int i = 0; i < size; ++i) {
            delete[] result[i];
        }
        //Free the array of pointers
        delete[] result;

    }